

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O0

int Abc_NtkHaigCheckTfi_rec(Abc_Obj_t *pNode,Abc_Obj_t *pOld)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pOld_local;
  Abc_Obj_t *pNode_local;
  
  if (pNode == (Abc_Obj_t *)0x0) {
    pNode_local._4_4_ = 0;
  }
  else if (pNode == pOld) {
    pNode_local._4_4_ = 1;
  }
  else {
    iVar1 = Abc_ObjIsCi(pNode);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsNode(pNode);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcHaig.c"
                      ,0x11d,"int Abc_NtkHaigCheckTfi_rec(Abc_Obj_t *, Abc_Obj_t *)");
      }
      iVar1 = Abc_NodeIsTravIdCurrent(pNode);
      if (iVar1 == 0) {
        Abc_NodeSetTravIdCurrent(pNode);
        pAVar2 = Abc_ObjFanin0(pNode);
        iVar1 = Abc_NtkHaigCheckTfi_rec(pAVar2,pOld);
        if (iVar1 == 0) {
          pAVar2 = Abc_ObjFanin1(pNode);
          iVar1 = Abc_NtkHaigCheckTfi_rec(pAVar2,pOld);
          if (iVar1 == 0) {
            pNode_local._4_4_ = Abc_NtkHaigCheckTfi_rec((Abc_Obj_t *)(pNode->field_5).pData,pOld);
          }
          else {
            pNode_local._4_4_ = 1;
          }
        }
        else {
          pNode_local._4_4_ = 1;
        }
      }
      else {
        pNode_local._4_4_ = 0;
      }
    }
    else {
      pNode_local._4_4_ = 0;
    }
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_NtkHaigCheckTfi_rec( Abc_Obj_t * pNode, Abc_Obj_t * pOld )
{
    if ( pNode == NULL )
        return 0;
    if ( pNode == pOld )
        return 1;
    // check the trivial cases
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    assert( Abc_ObjIsNode(pNode) );
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return 0;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // check the children
    if ( Abc_NtkHaigCheckTfi_rec( Abc_ObjFanin0(pNode), pOld ) )
        return 1;
    if ( Abc_NtkHaigCheckTfi_rec( Abc_ObjFanin1(pNode), pOld ) )
        return 1;
    // check equivalent nodes
    return Abc_NtkHaigCheckTfi_rec( (Abc_Obj_t *)pNode->pData, pOld );
}